

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_striped_sse2_128_8.c
# Opt level: O3

parasail_result_t *
parasail_nw_table_striped_profile_sse2_128_8
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  void *pvVar12;
  parasail_matrix_t *ppVar13;
  int *piVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  ulong uVar18;
  undefined1 auVar19 [16];
  uint uVar20;
  int iVar21;
  uint uVar22;
  parasail_result_t *ppVar23;
  __m128i *palVar24;
  __m128i *ptr;
  __m128i *ptr_00;
  int8_t *ptr_01;
  int iVar25;
  long lVar26;
  int iVar27;
  char cVar28;
  int iVar29;
  ulong uVar30;
  __m128i *ptr_02;
  long lVar31;
  int iVar32;
  long lVar33;
  long lVar34;
  char cVar35;
  uint uVar36;
  ulong uVar37;
  undefined4 uVar38;
  undefined1 uVar61;
  undefined1 uVar62;
  undefined1 uVar63;
  undefined1 auVar41 [16];
  undefined4 uVar39;
  undefined1 auVar42 [16];
  undefined4 uVar40;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  ulong uVar64;
  int iVar65;
  int iVar76;
  int iVar77;
  int iVar78;
  int iVar79;
  int iVar80;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  int iVar95;
  int iVar97;
  int iVar98;
  undefined1 auVar96 [16];
  int iVar99;
  __m128i_8_t A;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 in_XMM7 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  __m128i_8_t e;
  __m128i_8_t h;
  int local_1ac;
  longlong local_58;
  longlong lStack_50;
  longlong local_48;
  longlong lStack_40;
  char cVar110;
  char cVar111;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_nw_table_striped_profile_sse2_128_8_cold_8();
  }
  else {
    pvVar12 = (profile->profile8).score;
    if (pvVar12 == (void *)0x0) {
      parasail_nw_table_striped_profile_sse2_128_8_cold_7();
    }
    else {
      ppVar13 = profile->matrix;
      if (ppVar13 == (parasail_matrix_t *)0x0) {
        parasail_nw_table_striped_profile_sse2_128_8_cold_6();
      }
      else {
        uVar22 = profile->s1Len;
        if ((int)uVar22 < 1) {
          parasail_nw_table_striped_profile_sse2_128_8_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_nw_table_striped_profile_sse2_128_8_cold_4();
        }
        else {
          uVar64 = (ulong)(uint)s2Len;
          if (s2Len < 1) {
            parasail_nw_table_striped_profile_sse2_128_8_cold_3();
          }
          else if (open < 0) {
            parasail_nw_table_striped_profile_sse2_128_8_cold_2();
          }
          else if (gap < 0) {
            parasail_nw_table_striped_profile_sse2_128_8_cold_1();
          }
          else {
            uVar20 = uVar22 - 1;
            uVar37 = (ulong)uVar22 + 0xf >> 4;
            iVar21 = (int)(uVar20 / uVar37);
            iVar27 = -open;
            iVar25 = ppVar13->min;
            uVar38 = CONCAT31((int3)((uint)iVar25 >> 8),-(char)iVar25);
            uVar36 = (uint)(byte)-(char)iVar25;
            if (iVar25 != iVar27 && SBORROW4(iVar25,iVar27) == iVar25 + open < 0) {
              uVar36 = open;
            }
            cVar28 = '~' - (char)ppVar13->max;
            ppVar23 = parasail_result_new_table1((uint)((ulong)uVar22 + 0xf) & 0x7ffffff0,s2Len);
            if (ppVar23 != (parasail_result_t *)0x0) {
              ppVar23->flag = ppVar23->flag | 0x10120801;
              palVar24 = parasail_memalign___m128i(0x10,uVar37);
              ptr = parasail_memalign___m128i(0x10,uVar37);
              ptr_00 = parasail_memalign___m128i(0x10,uVar37);
              ptr_01 = parasail_memalign_int8_t(0x10,(ulong)(s2Len + 1));
              auVar41._0_4_ = -(uint)((int)((ulong)palVar24 >> 0x20) == 0 && (int)palVar24 == 0);
              auVar41._4_4_ = -(uint)((int)ptr == 0 && (int)((ulong)ptr >> 0x20) == 0);
              auVar41._8_4_ = -(uint)((int)((ulong)ptr_00 >> 0x20) == 0 && (int)ptr_00 == 0);
              auVar41._12_4_ = -(uint)((int)ptr_01 == 0 && (int)((ulong)ptr_01 >> 0x20) == 0);
              iVar25 = movmskps(uVar38,auVar41);
              if (iVar25 == 0) {
                iVar25 = s2Len + -1;
                uVar63 = (undefined1)((uint)open >> 0x18);
                uVar62 = (undefined1)((uint)open >> 0x10);
                uVar61 = (undefined1)((uint)open >> 8);
                auVar42._4_4_ =
                     (int)(CONCAT35(CONCAT21(CONCAT11(uVar63,uVar63),uVar62),CONCAT14(uVar62,open))
                          >> 0x20);
                auVar42[3] = uVar61;
                auVar42[2] = uVar61;
                auVar42[0] = (undefined1)open;
                auVar42[1] = auVar42[0];
                auVar42._8_8_ = 0;
                auVar41 = pshuflw(auVar42,auVar42,0);
                uVar38 = auVar41._0_4_;
                auVar81._4_4_ = uVar38;
                auVar81._0_4_ = uVar38;
                auVar81._8_4_ = uVar38;
                auVar81._12_4_ = uVar38;
                uVar61 = (undefined1)((uint)gap >> 0x10);
                uVar62 = (undefined1)((uint)gap >> 0x18);
                auVar73[7] = uVar62;
                auVar73[6] = uVar62;
                auVar73[5] = uVar61;
                auVar73[4] = uVar61;
                uVar61 = (undefined1)((uint)gap >> 8);
                auVar73[3] = uVar61;
                auVar73[2] = uVar61;
                auVar73[0] = (undefined1)gap;
                auVar73[1] = auVar73[0];
                auVar73._8_8_ = 0;
                auVar41 = pshuflw(auVar73,auVar73,0);
                uVar38 = auVar41._0_4_;
                cVar35 = (char)uVar36 + -0x7f;
                auVar41 = ZEXT216(CONCAT11(cVar35,cVar35));
                auVar41 = pshuflw(auVar41,auVar41,0);
                uVar39 = auVar41._0_4_;
                auVar42 = ZEXT216(CONCAT11(cVar28,cVar28));
                auVar42 = pshuflw(auVar42,auVar42,0);
                uVar40 = auVar42._0_4_;
                auVar57._4_4_ = uVar40;
                auVar57._0_4_ = uVar40;
                auVar57._8_4_ = uVar40;
                auVar57._12_4_ = uVar40;
                lVar26 = (long)iVar27;
                uVar30 = 0;
                do {
                  lVar33 = 0;
                  lVar31 = lVar26;
                  do {
                    uVar61 = 0x80;
                    if (-0x80 < lVar31) {
                      uVar61 = (undefined1)lVar31;
                    }
                    *(undefined1 *)((long)&local_48 + lVar33) = uVar61;
                    lVar34 = lVar31 - (ulong)(uint)open;
                    if (lVar34 < -0x7f) {
                      lVar34 = -0x80;
                    }
                    *(char *)((long)&local_58 + lVar33) = (char)lVar34;
                    lVar33 = lVar33 + 1;
                    lVar31 = lVar31 - uVar37 * (uint)gap;
                  } while (lVar33 != 0x10);
                  palVar24[uVar30][0] = local_48;
                  palVar24[uVar30][1] = lStack_40;
                  ptr_00[uVar30][0] = local_58;
                  ptr_00[uVar30][1] = lStack_50;
                  uVar30 = uVar30 + 1;
                  lVar26 = lVar26 - (ulong)(uint)gap;
                } while (uVar30 != uVar37);
                *ptr_01 = '\0';
                auVar19 = _DAT_00904ba0;
                auVar73 = _DAT_00903aa0;
                lVar26 = uVar64 - 1;
                auVar106._8_4_ = (int)lVar26;
                auVar106._0_8_ = lVar26;
                auVar106._12_4_ = (int)((ulong)lVar26 >> 0x20);
                iVar29 = -gap;
                iVar32 = 0;
                auVar55._8_4_ = 0xffffffff;
                auVar55._0_8_ = 0xffffffffffffffff;
                auVar55._12_4_ = 0xffffffff;
                uVar30 = 0;
                auVar82 = auVar57;
                do {
                  uVar40 = (undefined4)uVar30;
                  auVar118._8_4_ = uVar40;
                  auVar118._0_8_ = uVar30;
                  auVar118._12_4_ = (int)(uVar30 >> 0x20);
                  auVar96 = auVar106 ^ auVar73;
                  auVar43 = (auVar118 | _DAT_00903a90) ^ auVar73;
                  iVar95 = auVar96._0_4_;
                  iVar65 = -(uint)(iVar95 < auVar43._0_4_);
                  iVar97 = auVar96._4_4_;
                  iVar76 = -(uint)(iVar97 < auVar43._4_4_);
                  iVar98 = auVar96._8_4_;
                  iVar78 = -(uint)(iVar98 < auVar43._8_4_);
                  iVar99 = auVar96._12_4_;
                  iVar79 = -(uint)(iVar99 < auVar43._12_4_);
                  auVar88._4_4_ = iVar65;
                  auVar88._0_4_ = iVar65;
                  auVar88._8_4_ = iVar78;
                  auVar88._12_4_ = iVar78;
                  auVar82 = pshuflw(auVar82,auVar88,0xe8);
                  iVar65 = -(uint)(auVar43._4_4_ == iVar97);
                  iVar78 = -(uint)(auVar43._12_4_ == iVar99);
                  auVar47._4_4_ = iVar65;
                  auVar47._0_4_ = iVar65;
                  auVar47._8_4_ = iVar78;
                  auVar47._12_4_ = iVar78;
                  auVar112 = pshuflw(in_XMM11,auVar47,0xe8);
                  auVar43._4_4_ = iVar76;
                  auVar43._0_4_ = iVar76;
                  auVar43._8_4_ = iVar79;
                  auVar43._12_4_ = iVar79;
                  auVar96 = pshuflw(auVar82,auVar43,0xe8);
                  auVar82 = (auVar96 | auVar112 & auVar82) ^ auVar55;
                  auVar82 = packssdw(auVar82,auVar82);
                  auVar96._0_4_ = iVar27 - iVar32;
                  auVar96._4_4_ = iVar29 - open;
                  auVar96._8_4_ = iVar27 - (gap * 2 + iVar32);
                  auVar96._12_4_ = iVar27 - (gap * 3 + iVar32);
                  iVar65 = auVar19._0_4_;
                  auVar112._0_4_ = -(uint)(iVar65 < auVar96._0_4_);
                  iVar78 = auVar19._4_4_;
                  auVar112._4_4_ = -(uint)(iVar78 < auVar96._4_4_);
                  iVar76 = auVar19._8_4_;
                  auVar112._8_4_ = -(uint)(iVar76 < auVar96._8_4_);
                  iVar79 = auVar19._12_4_;
                  auVar112._12_4_ = -(uint)(iVar79 < auVar96._12_4_);
                  auVar96 = ~auVar112 & auVar19 | auVar96 & auVar112;
                  if ((auVar82 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    ptr_01[uVar30 + 1] = auVar96[0];
                  }
                  auVar43 = auVar47 & auVar88 | auVar43;
                  auVar82 = packssdw(auVar43,auVar43);
                  auVar82 = packssdw(auVar82 ^ auVar55,auVar82 ^ auVar55);
                  auVar82 = packsswb(auVar82,auVar82);
                  if ((auVar82._0_4_ >> 8 & 1) != 0) {
                    ptr_01[uVar30 + 2] = auVar96[4];
                  }
                  auVar82 = (auVar118 | _DAT_00903a80) ^ auVar73;
                  auVar100._0_4_ = -(uint)(iVar95 < auVar82._0_4_);
                  auVar100._4_4_ = -(uint)(iVar97 < auVar82._4_4_);
                  auVar100._8_4_ = -(uint)(iVar98 < auVar82._8_4_);
                  auVar100._12_4_ = -(uint)(iVar99 < auVar82._12_4_);
                  auVar68._4_4_ = auVar100._0_4_;
                  auVar68._0_4_ = auVar100._0_4_;
                  auVar68._8_4_ = auVar100._8_4_;
                  auVar68._12_4_ = auVar100._8_4_;
                  iVar77 = -(uint)(auVar82._4_4_ == iVar97);
                  iVar80 = -(uint)(auVar82._12_4_ == iVar99);
                  auVar83._4_4_ = iVar77;
                  auVar83._0_4_ = iVar77;
                  auVar83._8_4_ = iVar80;
                  auVar83._12_4_ = iVar80;
                  auVar115._4_4_ = auVar100._4_4_;
                  auVar115._0_4_ = auVar100._4_4_;
                  auVar115._8_4_ = auVar100._12_4_;
                  auVar115._12_4_ = auVar100._12_4_;
                  auVar82 = auVar83 & auVar68 | auVar115;
                  auVar82 = packssdw(auVar82,auVar82);
                  auVar82 = packssdw(auVar82 ^ auVar55,auVar82 ^ auVar55);
                  auVar82 = packsswb(auVar82,auVar82);
                  if ((auVar82._0_4_ >> 0x10 & 1) != 0) {
                    ptr_01[uVar30 + 3] = auVar96[8];
                  }
                  auVar43 = pshufhw(auVar68,auVar68,0x84);
                  auVar112 = pshufhw(auVar82,auVar83,0x84);
                  auVar82 = pshufhw(auVar43,auVar115,0x84);
                  auVar82 = (auVar82 | auVar112 & auVar43) ^ auVar55;
                  auVar82 = packssdw(auVar82,auVar82);
                  auVar82 = packsswb(auVar82,auVar82);
                  if ((auVar82._0_4_ >> 0x18 & 1) != 0) {
                    ptr_01[uVar30 + 4] = auVar96[0xc];
                  }
                  auVar113._4_4_ = uVar40;
                  auVar113._0_4_ = uVar40;
                  auVar113._8_4_ = uVar40;
                  auVar113._12_4_ = uVar40;
                  auVar82 = auVar113 | _DAT_00904a90;
                  iVar77 = auVar82._4_4_;
                  auVar84._4_4_ = iVar77;
                  auVar84._0_4_ = iVar77;
                  auVar84._8_4_ = auVar82._12_4_;
                  auVar84._12_4_ = auVar82._12_4_;
                  auVar85._0_4_ = iVar27 - auVar82._0_4_ * gap;
                  auVar85._4_4_ = iVar27 - iVar77 * gap;
                  auVar85._8_4_ = iVar27 - (int)((auVar82._8_8_ & 0xffffffff) * (ulong)(uint)gap);
                  auVar85._12_4_ = iVar27 - (int)((auVar84._8_8_ & 0xffffffff) * (ulong)(uint)gap);
                  auVar116._0_4_ = -(uint)(iVar65 < auVar85._0_4_);
                  auVar116._4_4_ = -(uint)(iVar78 < auVar85._4_4_);
                  auVar116._8_4_ = -(uint)(iVar76 < auVar85._8_4_);
                  auVar116._12_4_ = -(uint)(iVar79 < auVar85._12_4_);
                  auVar112 = ~auVar116 & auVar19 | auVar85 & auVar116;
                  auVar82 = (auVar118 | _DAT_00903ad0) ^ auVar73;
                  iVar77 = -(uint)(iVar95 < auVar82._0_4_);
                  auVar45._4_4_ = -(uint)(iVar97 < auVar82._4_4_);
                  iVar80 = -(uint)(iVar98 < auVar82._8_4_);
                  auVar45._12_4_ = -(uint)(iVar99 < auVar82._12_4_);
                  auVar86._4_4_ = iVar77;
                  auVar86._0_4_ = iVar77;
                  auVar86._8_4_ = iVar80;
                  auVar86._12_4_ = iVar80;
                  auVar43 = pshuflw(auVar100,auVar86,0xe8);
                  auVar44._4_4_ = -(uint)(auVar82._4_4_ == iVar97);
                  auVar44._12_4_ = -(uint)(auVar82._12_4_ == iVar99);
                  auVar44._0_4_ = auVar44._4_4_;
                  auVar44._8_4_ = auVar44._12_4_;
                  auVar96 = pshuflw(in_XMM7,auVar44,0xe8);
                  auVar45._0_4_ = auVar45._4_4_;
                  auVar45._8_4_ = auVar45._12_4_;
                  auVar82 = pshuflw(auVar43,auVar45,0xe8);
                  auVar82 = (auVar82 | auVar96 & auVar43) ^ auVar55;
                  auVar82 = packssdw(auVar82,auVar82);
                  auVar82 = packsswb(auVar82,auVar82);
                  if ((auVar82 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                    ptr_01[uVar30 + 5] = auVar112[0];
                  }
                  auVar45 = auVar44 & auVar86 | auVar45;
                  auVar82 = packssdw(auVar45,auVar45);
                  auVar82 = packssdw(auVar82 ^ auVar55,auVar82 ^ auVar55);
                  auVar82 = packsswb(auVar82,auVar82);
                  if ((auVar82._4_2_ >> 8 & 1) != 0) {
                    ptr_01[uVar30 + 6] = auVar112[4];
                  }
                  auVar82 = (auVar118 | _DAT_00903ac0) ^ auVar73;
                  auVar101._0_4_ = -(uint)(iVar95 < auVar82._0_4_);
                  auVar101._4_4_ = -(uint)(iVar97 < auVar82._4_4_);
                  auVar101._8_4_ = -(uint)(iVar98 < auVar82._8_4_);
                  auVar101._12_4_ = -(uint)(iVar99 < auVar82._12_4_);
                  auVar46._4_4_ = auVar101._0_4_;
                  auVar46._0_4_ = auVar101._0_4_;
                  auVar46._8_4_ = auVar101._8_4_;
                  auVar46._12_4_ = auVar101._8_4_;
                  iVar77 = -(uint)(auVar82._4_4_ == iVar97);
                  iVar80 = -(uint)(auVar82._12_4_ == iVar99);
                  auVar87._4_4_ = iVar77;
                  auVar87._0_4_ = iVar77;
                  auVar87._8_4_ = iVar80;
                  auVar87._12_4_ = iVar80;
                  auVar66._4_4_ = auVar101._4_4_;
                  auVar66._0_4_ = auVar101._4_4_;
                  auVar66._8_4_ = auVar101._12_4_;
                  auVar66._12_4_ = auVar101._12_4_;
                  auVar43 = auVar87 & auVar46 | auVar66;
                  auVar82 = packssdw(auVar101,auVar43);
                  auVar82 = packssdw(auVar82 ^ auVar55,auVar82 ^ auVar55);
                  auVar82 = packsswb(auVar82,auVar82);
                  if ((auVar82 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                    ptr_01[uVar30 + 7] = auVar112[8];
                  }
                  auVar96 = pshufhw(auVar46,auVar46,0x84);
                  auVar88 = pshufhw(auVar87,auVar87,0x84);
                  auVar47 = pshufhw(auVar96,auVar66,0x84);
                  auVar96 = (auVar47 | auVar88 & auVar96) ^ auVar55;
                  auVar96 = packssdw(auVar96,auVar96);
                  auVar96 = packsswb(auVar96,auVar96);
                  if ((auVar96._6_2_ >> 8 & 1) != 0) {
                    ptr_01[uVar30 + 8] = auVar112[0xc];
                  }
                  auVar96 = auVar113 | _DAT_00904b80;
                  iVar77 = auVar96._4_4_;
                  auVar89._4_4_ = iVar77;
                  auVar89._0_4_ = iVar77;
                  auVar89._8_4_ = auVar96._12_4_;
                  auVar89._12_4_ = auVar96._12_4_;
                  auVar90._0_4_ = iVar27 - auVar96._0_4_ * gap;
                  auVar90._4_4_ = iVar27 - iVar77 * gap;
                  auVar90._8_4_ = iVar27 - (int)((auVar96._8_8_ & 0xffffffff) * (ulong)(uint)gap);
                  auVar90._12_4_ = iVar27 - (int)((auVar89._8_8_ & 0xffffffff) * (ulong)(uint)gap);
                  auVar117._0_4_ = -(uint)(iVar65 < auVar90._0_4_);
                  auVar117._4_4_ = -(uint)(iVar78 < auVar90._4_4_);
                  auVar117._8_4_ = -(uint)(iVar76 < auVar90._8_4_);
                  auVar117._12_4_ = -(uint)(iVar79 < auVar90._12_4_);
                  auVar112 = ~auVar117 & auVar19 | auVar90 & auVar117;
                  auVar96 = (auVar118 | _DAT_00904b70) ^ auVar73;
                  iVar77 = -(uint)(iVar95 < auVar96._0_4_);
                  auVar49._4_4_ = -(uint)(iVar97 < auVar96._4_4_);
                  iVar80 = -(uint)(iVar98 < auVar96._8_4_);
                  auVar49._12_4_ = -(uint)(iVar99 < auVar96._12_4_);
                  auVar91._4_4_ = iVar77;
                  auVar91._0_4_ = iVar77;
                  auVar91._8_4_ = iVar80;
                  auVar91._12_4_ = iVar80;
                  auVar82 = pshuflw(auVar82,auVar91,0xe8);
                  auVar48._4_4_ = -(uint)(auVar96._4_4_ == iVar97);
                  auVar48._12_4_ = -(uint)(auVar96._12_4_ == iVar99);
                  auVar48._0_4_ = auVar48._4_4_;
                  auVar48._8_4_ = auVar48._12_4_;
                  auVar96 = pshuflw(auVar43,auVar48,0xe8);
                  auVar49._0_4_ = auVar49._4_4_;
                  auVar49._8_4_ = auVar49._12_4_;
                  auVar43 = pshuflw(auVar82,auVar49,0xe8);
                  auVar43 = (auVar43 | auVar96 & auVar82) ^ auVar55;
                  auVar43 = packssdw(auVar43,auVar43);
                  auVar43 = packsswb(auVar43,auVar43);
                  if ((auVar43 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    ptr_01[uVar30 + 9] = auVar112[0];
                  }
                  auVar49 = auVar48 & auVar91 | auVar49;
                  auVar43 = packssdw(auVar49,auVar49);
                  auVar43 = packssdw(auVar43 ^ auVar55,auVar43 ^ auVar55);
                  auVar43 = packsswb(auVar43,auVar43);
                  if ((auVar43._8_2_ >> 8 & 1) != 0) {
                    ptr_01[uVar30 + 10] = auVar112[4];
                  }
                  auVar43 = (auVar118 | _DAT_00904b60) ^ auVar73;
                  iVar77 = -(uint)(iVar95 < auVar43._0_4_);
                  auVar92._4_4_ = -(uint)(iVar97 < auVar43._4_4_);
                  iVar80 = -(uint)(iVar98 < auVar43._8_4_);
                  auVar92._12_4_ = -(uint)(iVar99 < auVar43._12_4_);
                  auVar50._4_4_ = iVar77;
                  auVar50._0_4_ = iVar77;
                  auVar50._8_4_ = iVar80;
                  auVar50._12_4_ = iVar80;
                  auVar67._4_4_ = -(uint)(auVar43._4_4_ == iVar97);
                  auVar67._12_4_ = -(uint)(auVar43._12_4_ == iVar99);
                  auVar67._0_4_ = auVar67._4_4_;
                  auVar67._8_4_ = auVar67._12_4_;
                  auVar92._0_4_ = auVar92._4_4_;
                  auVar92._8_4_ = auVar92._12_4_;
                  auVar43 = auVar67 & auVar50 | auVar92;
                  auVar43 = packssdw(auVar43,auVar43);
                  auVar43 = packssdw(auVar43 ^ auVar55,auVar43 ^ auVar55);
                  auVar43 = packsswb(auVar43,auVar43);
                  if ((auVar43 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                    ptr_01[uVar30 + 0xb] = auVar112[8];
                  }
                  auVar47 = pshufhw(auVar50,auVar50,0x84);
                  auVar68 = pshufhw(auVar67,auVar67,0x84);
                  auVar88 = pshufhw(auVar47,auVar92,0x84);
                  auVar47 = (auVar88 | auVar68 & auVar47) ^ auVar55;
                  auVar47 = packssdw(auVar47,auVar47);
                  auVar47 = packsswb(auVar47,auVar47);
                  if ((auVar47._10_2_ >> 8 & 1) != 0) {
                    ptr_01[uVar30 + 0xc] = auVar112[0xc];
                  }
                  auVar113 = auVar113 | _DAT_00904b90;
                  iVar77 = auVar113._4_4_;
                  auVar69._4_4_ = iVar77;
                  auVar69._0_4_ = iVar77;
                  auVar69._8_4_ = auVar113._12_4_;
                  auVar69._12_4_ = auVar113._12_4_;
                  auVar70._0_4_ = iVar27 - auVar113._0_4_ * gap;
                  auVar70._4_4_ = iVar27 - iVar77 * gap;
                  auVar70._8_4_ = iVar27 - (int)((auVar113._8_8_ & 0xffffffff) * (ulong)(uint)gap);
                  auVar70._12_4_ = iVar27 - (int)((auVar69._8_8_ & 0xffffffff) * (ulong)(uint)gap);
                  auVar114._0_4_ = -(uint)(iVar65 < auVar70._0_4_);
                  auVar114._4_4_ = -(uint)(iVar78 < auVar70._4_4_);
                  auVar114._8_4_ = -(uint)(iVar76 < auVar70._8_4_);
                  auVar114._12_4_ = -(uint)(iVar79 < auVar70._12_4_);
                  in_XMM11 = ~auVar114 & auVar19 | auVar70 & auVar114;
                  auVar112 = (auVar118 | _DAT_00904b50) ^ auVar73;
                  iVar65 = -(uint)(iVar95 < auVar112._0_4_);
                  auVar52._4_4_ = -(uint)(iVar97 < auVar112._4_4_);
                  iVar78 = -(uint)(iVar98 < auVar112._8_4_);
                  auVar52._12_4_ = -(uint)(iVar99 < auVar112._12_4_);
                  auVar93._4_4_ = iVar65;
                  auVar93._0_4_ = iVar65;
                  auVar93._8_4_ = iVar78;
                  auVar93._12_4_ = iVar78;
                  auVar43 = pshuflw(auVar43,auVar93,0xe8);
                  auVar51._4_4_ = -(uint)(auVar112._4_4_ == iVar97);
                  auVar51._12_4_ = -(uint)(auVar112._12_4_ == iVar99);
                  auVar51._0_4_ = auVar51._4_4_;
                  auVar51._8_4_ = auVar51._12_4_;
                  in_XMM7 = pshuflw(auVar96 & auVar82,auVar51,0xe8);
                  in_XMM7 = in_XMM7 & auVar43;
                  auVar52._0_4_ = auVar52._4_4_;
                  auVar52._8_4_ = auVar52._12_4_;
                  auVar82 = pshuflw(auVar43,auVar52,0xe8);
                  auVar82 = (auVar82 | in_XMM7) ^ auVar55;
                  auVar82 = packssdw(auVar82,auVar82);
                  auVar82 = packsswb(auVar82,auVar82);
                  if ((auVar82 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                    ptr_01[uVar30 + 0xd] = in_XMM11[0];
                  }
                  auVar52 = auVar51 & auVar93 | auVar52;
                  auVar82 = packssdw(auVar52,auVar52);
                  auVar82 = packssdw(auVar82 ^ auVar55,auVar82 ^ auVar55);
                  auVar82 = packsswb(auVar82,auVar82);
                  if ((auVar82._12_2_ >> 8 & 1) != 0) {
                    ptr_01[uVar30 + 0xe] = in_XMM11[4];
                  }
                  auVar43 = (auVar118 | _DAT_00904b40) ^ auVar73;
                  iVar65 = -(uint)(iVar95 < auVar43._0_4_);
                  auVar82._4_4_ = -(uint)(iVar97 < auVar43._4_4_);
                  iVar78 = -(uint)(iVar98 < auVar43._8_4_);
                  auVar82._12_4_ = -(uint)(iVar99 < auVar43._12_4_);
                  auVar53._4_4_ = iVar65;
                  auVar53._0_4_ = iVar65;
                  auVar53._8_4_ = iVar78;
                  auVar53._12_4_ = iVar78;
                  iVar65 = -(uint)(auVar43._4_4_ == iVar97);
                  iVar78 = -(uint)(auVar43._12_4_ == iVar99);
                  auVar71._4_4_ = iVar65;
                  auVar71._0_4_ = iVar65;
                  auVar71._8_4_ = iVar78;
                  auVar71._12_4_ = iVar78;
                  auVar82._0_4_ = auVar82._4_4_;
                  auVar82._8_4_ = auVar82._12_4_;
                  auVar43 = auVar71 & auVar53 | auVar82;
                  auVar43 = packssdw(auVar43,auVar43);
                  auVar43 = packssdw(auVar43 ^ auVar55,auVar43 ^ auVar55);
                  auVar43 = packsswb(auVar43,auVar43);
                  if ((auVar43 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                    ptr_01[uVar30 + 0xf] = in_XMM11[8];
                  }
                  auVar43 = pshufhw(auVar53,auVar53,0x84);
                  auVar112 = pshufhw(auVar71,auVar71,0x84);
                  auVar96 = pshufhw(auVar43,auVar82,0x84);
                  auVar43 = (auVar96 | auVar112 & auVar43) ^ auVar55;
                  auVar43 = packssdw(auVar43,auVar43);
                  auVar43 = packsswb(auVar43,auVar43);
                  if ((auVar43._14_2_ >> 8 & 1) != 0) {
                    ptr_01[uVar30 + 0x10] = in_XMM11[0xc];
                  }
                  auVar43 = _DAT_00904bb0;
                  uVar30 = uVar30 + 0x10;
                  iVar29 = iVar29 + gap * -0x10;
                  iVar32 = iVar32 + gap * 0x10;
                } while ((s2Len + 0xfU & 0xfffffff0) != uVar30);
                lVar26 = uVar37 * uVar64;
                auVar19._4_4_ = uVar39;
                auVar19._0_4_ = uVar39;
                auVar19._8_4_ = uVar39;
                auVar19._12_4_ = uVar39;
                lVar31 = 0;
                uVar30 = 0;
                auVar73 = auVar19;
                do {
                  ptr_02 = ptr;
                  ptr = palVar24;
                  uVar18 = ptr[(int)uVar37 - 1][0];
                  auVar54._0_8_ = uVar18 << 8;
                  auVar54._8_8_ = ptr[(int)uVar37 - 1][1] << 8 | uVar18 >> 0x38;
                  iVar27 = ppVar13->mapper[(byte)s2[uVar30]];
                  auVar54 = ~auVar43 & ZEXT116((byte)ptr_01[uVar30]) | auVar54;
                  lVar34 = 0;
                  lVar33 = lVar31;
                  auVar82 = auVar19;
                  do {
                    auVar55 = paddsb(auVar54,*(undefined1 (*) [16])
                                              ((long)pvVar12 + lVar34 + uVar37 * (long)iVar27 * 0x10
                                              ));
                    auVar106 = *(undefined1 (*) [16])((long)*ptr_00 + lVar34);
                    auVar107[0] = -(auVar106[0] < auVar55[0]);
                    auVar107[1] = -(auVar106[1] < auVar55[1]);
                    auVar107[2] = -(auVar106[2] < auVar55[2]);
                    auVar107[3] = -(auVar106[3] < auVar55[3]);
                    auVar107[4] = -(auVar106[4] < auVar55[4]);
                    auVar107[5] = -(auVar106[5] < auVar55[5]);
                    auVar107[6] = -(auVar106[6] < auVar55[6]);
                    auVar107[7] = -(auVar106[7] < auVar55[7]);
                    auVar107[8] = -(auVar106[8] < auVar55[8]);
                    auVar107[9] = -(auVar106[9] < auVar55[9]);
                    auVar107[10] = -(auVar106[10] < auVar55[10]);
                    auVar107[0xb] = -(auVar106[0xb] < auVar55[0xb]);
                    auVar107[0xc] = -(auVar106[0xc] < auVar55[0xc]);
                    auVar107[0xd] = -(auVar106[0xd] < auVar55[0xd]);
                    auVar107[0xe] = -(auVar106[0xe] < auVar55[0xe]);
                    auVar107[0xf] = -(auVar106[0xf] < auVar55[0xf]);
                    auVar55 = ~auVar107 & auVar106 | auVar55 & auVar107;
                    auVar104[0] = -(auVar82[0] < auVar55[0]);
                    auVar104[1] = -(auVar82[1] < auVar55[1]);
                    auVar104[2] = -(auVar82[2] < auVar55[2]);
                    auVar104[3] = -(auVar82[3] < auVar55[3]);
                    auVar104[4] = -(auVar82[4] < auVar55[4]);
                    auVar104[5] = -(auVar82[5] < auVar55[5]);
                    auVar104[6] = -(auVar82[6] < auVar55[6]);
                    auVar104[7] = -(auVar82[7] < auVar55[7]);
                    auVar104[8] = -(auVar82[8] < auVar55[8]);
                    auVar104[9] = -(auVar82[9] < auVar55[9]);
                    auVar104[10] = -(auVar82[10] < auVar55[10]);
                    auVar104[0xb] = -(auVar82[0xb] < auVar55[0xb]);
                    auVar104[0xc] = -(auVar82[0xc] < auVar55[0xc]);
                    auVar104[0xd] = -(auVar82[0xd] < auVar55[0xd]);
                    auVar104[0xe] = -(auVar82[0xe] < auVar55[0xe]);
                    auVar104[0xf] = -(auVar82[0xf] < auVar55[0xf]);
                    auVar55 = ~auVar104 & auVar82 | auVar55 & auVar104;
                    *(undefined1 (*) [16])((long)*ptr_02 + lVar34) = auVar55;
                    piVar14 = ((ppVar23->field_4).rowcols)->score_row;
                    cVar28 = *(char *)((long)*ptr_02 + lVar34 + 1);
                    cVar35 = *(char *)((long)*ptr_02 + lVar34 + 2);
                    cVar110 = *(char *)((long)*ptr_02 + lVar34 + 3);
                    cVar111 = *(char *)((long)*ptr_02 + lVar34 + 4);
                    cVar1 = *(char *)((long)*ptr_02 + lVar34 + 5);
                    cVar2 = *(char *)((long)*ptr_02 + lVar34 + 6);
                    cVar3 = *(char *)((long)*ptr_02 + lVar34 + 7);
                    cVar4 = *(char *)((long)*ptr_02 + lVar34 + 8);
                    cVar5 = *(char *)((long)*ptr_02 + lVar34 + 9);
                    cVar6 = *(char *)((long)*ptr_02 + lVar34 + 10);
                    cVar7 = *(char *)((long)*ptr_02 + lVar34 + 0xb);
                    cVar8 = *(char *)((long)*ptr_02 + lVar34 + 0xc);
                    cVar9 = *(char *)((long)*ptr_02 + lVar34 + 0xd);
                    cVar10 = *(char *)((long)*ptr_02 + lVar34 + 0xe);
                    cVar11 = *(char *)((long)*ptr_02 + lVar34 + 0xf);
                    *(int *)((long)piVar14 + lVar33) = (int)*(char *)((long)*ptr_02 + lVar34);
                    *(int *)((long)piVar14 + lVar26 * 4 + lVar33) = (int)cVar28;
                    *(int *)((long)piVar14 + lVar26 * 8 + lVar33) = (int)cVar35;
                    *(int *)((long)piVar14 + lVar26 * 0xc + lVar33) = (int)cVar110;
                    *(int *)((long)piVar14 + lVar26 * 0x10 + lVar33) = (int)cVar111;
                    *(int *)((long)piVar14 + lVar26 * 0x14 + lVar33) = (int)cVar1;
                    *(int *)((long)piVar14 + lVar26 * 0x18 + lVar33) = (int)cVar2;
                    *(int *)((long)piVar14 + lVar26 * 0x1c + lVar33) = (int)cVar3;
                    *(int *)((long)piVar14 + lVar26 * 0x20 + lVar33) = (int)cVar4;
                    *(int *)((long)piVar14 + lVar26 * 0x24 + lVar33) = (int)cVar5;
                    *(int *)((long)piVar14 + lVar26 * 0x28 + lVar33) = (int)cVar6;
                    *(int *)((long)piVar14 + lVar26 * 0x2c + lVar33) = (int)cVar7;
                    *(int *)((long)piVar14 + lVar26 * 0x30 + lVar33) = (int)cVar8;
                    *(int *)((long)piVar14 + lVar26 * 0x34 + lVar33) = (int)cVar9;
                    *(int *)((long)piVar14 + lVar26 * 0x38 + lVar33) = (int)cVar10;
                    *(int *)((long)piVar14 + lVar26 * 0x3c + lVar33) = (int)cVar11;
                    auVar72[0] = -(auVar55[0] < auVar73[0]);
                    auVar72[1] = -(auVar55[1] < auVar73[1]);
                    auVar72[2] = -(auVar55[2] < auVar73[2]);
                    auVar72[3] = -(auVar55[3] < auVar73[3]);
                    auVar72[4] = -(auVar55[4] < auVar73[4]);
                    auVar72[5] = -(auVar55[5] < auVar73[5]);
                    auVar72[6] = -(auVar55[6] < auVar73[6]);
                    auVar72[7] = -(auVar55[7] < auVar73[7]);
                    auVar72[8] = -(auVar55[8] < auVar73[8]);
                    auVar72[9] = -(auVar55[9] < auVar73[9]);
                    auVar72[10] = -(auVar55[10] < auVar73[10]);
                    auVar72[0xb] = -(auVar55[0xb] < auVar73[0xb]);
                    auVar72[0xc] = -(auVar55[0xc] < auVar73[0xc]);
                    auVar72[0xd] = -(auVar55[0xd] < auVar73[0xd]);
                    auVar72[0xe] = -(auVar55[0xe] < auVar73[0xe]);
                    auVar72[0xf] = -(auVar55[0xf] < auVar73[0xf]);
                    auVar73 = ~auVar72 & auVar55 | auVar73 & auVar72;
                    auVar56[0] = -(auVar55[0] < auVar57[0]);
                    auVar56[1] = -(auVar55[1] < auVar57[1]);
                    auVar56[2] = -(auVar55[2] < auVar57[2]);
                    auVar56[3] = -(auVar55[3] < auVar57[3]);
                    auVar56[4] = -(auVar55[4] < auVar57[4]);
                    auVar56[5] = -(auVar55[5] < auVar57[5]);
                    auVar56[6] = -(auVar55[6] < auVar57[6]);
                    auVar56[7] = -(auVar55[7] < auVar57[7]);
                    auVar56[8] = -(auVar55[8] < auVar57[8]);
                    auVar56[9] = -(auVar55[9] < auVar57[9]);
                    auVar56[10] = -(auVar55[10] < auVar57[10]);
                    auVar56[0xb] = -(auVar55[0xb] < auVar57[0xb]);
                    auVar56[0xc] = -(auVar55[0xc] < auVar57[0xc]);
                    auVar56[0xd] = -(auVar55[0xd] < auVar57[0xd]);
                    auVar56[0xe] = -(auVar55[0xe] < auVar57[0xe]);
                    auVar56[0xf] = -(auVar55[0xf] < auVar57[0xf]);
                    auVar57 = ~auVar56 & auVar57 | auVar55 & auVar56;
                    auVar108[0] = -(auVar106[0] < auVar57[0]);
                    auVar108[1] = -(auVar106[1] < auVar57[1]);
                    auVar108[2] = -(auVar106[2] < auVar57[2]);
                    auVar108[3] = -(auVar106[3] < auVar57[3]);
                    auVar108[4] = -(auVar106[4] < auVar57[4]);
                    auVar108[5] = -(auVar106[5] < auVar57[5]);
                    auVar108[6] = -(auVar106[6] < auVar57[6]);
                    auVar108[7] = -(auVar106[7] < auVar57[7]);
                    auVar108[8] = -(auVar106[8] < auVar57[8]);
                    auVar108[9] = -(auVar106[9] < auVar57[9]);
                    auVar108[10] = -(auVar106[10] < auVar57[10]);
                    auVar108[0xb] = -(auVar106[0xb] < auVar57[0xb]);
                    auVar108[0xc] = -(auVar106[0xc] < auVar57[0xc]);
                    auVar108[0xd] = -(auVar106[0xd] < auVar57[0xd]);
                    auVar108[0xe] = -(auVar106[0xe] < auVar57[0xe]);
                    auVar108[0xf] = -(auVar106[0xf] < auVar57[0xf]);
                    auVar57 = ~auVar108 & auVar57 | auVar106 & auVar108;
                    auVar94[0] = -(auVar82[0] < auVar57[0]);
                    auVar94[1] = -(auVar82[1] < auVar57[1]);
                    auVar94[2] = -(auVar82[2] < auVar57[2]);
                    auVar94[3] = -(auVar82[3] < auVar57[3]);
                    auVar94[4] = -(auVar82[4] < auVar57[4]);
                    auVar94[5] = -(auVar82[5] < auVar57[5]);
                    auVar94[6] = -(auVar82[6] < auVar57[6]);
                    auVar94[7] = -(auVar82[7] < auVar57[7]);
                    auVar94[8] = -(auVar82[8] < auVar57[8]);
                    auVar94[9] = -(auVar82[9] < auVar57[9]);
                    auVar94[10] = -(auVar82[10] < auVar57[10]);
                    auVar94[0xb] = -(auVar82[0xb] < auVar57[0xb]);
                    auVar94[0xc] = -(auVar82[0xc] < auVar57[0xc]);
                    auVar94[0xd] = -(auVar82[0xd] < auVar57[0xd]);
                    auVar94[0xe] = -(auVar82[0xe] < auVar57[0xe]);
                    auVar94[0xf] = -(auVar82[0xf] < auVar57[0xf]);
                    auVar57 = ~auVar94 & auVar57 | auVar82 & auVar94;
                    auVar55 = psubsb(auVar55,auVar81);
                    auVar15._4_4_ = uVar38;
                    auVar15._0_4_ = uVar38;
                    auVar15._8_4_ = uVar38;
                    auVar15._12_4_ = uVar38;
                    auVar106 = psubsb(auVar106,auVar15);
                    auVar58[0] = -(auVar55[0] < auVar106[0]);
                    auVar58[1] = -(auVar55[1] < auVar106[1]);
                    auVar58[2] = -(auVar55[2] < auVar106[2]);
                    auVar58[3] = -(auVar55[3] < auVar106[3]);
                    auVar58[4] = -(auVar55[4] < auVar106[4]);
                    auVar58[5] = -(auVar55[5] < auVar106[5]);
                    auVar58[6] = -(auVar55[6] < auVar106[6]);
                    auVar58[7] = -(auVar55[7] < auVar106[7]);
                    auVar58[8] = -(auVar55[8] < auVar106[8]);
                    auVar58[9] = -(auVar55[9] < auVar106[9]);
                    auVar58[10] = -(auVar55[10] < auVar106[10]);
                    auVar58[0xb] = -(auVar55[0xb] < auVar106[0xb]);
                    auVar58[0xc] = -(auVar55[0xc] < auVar106[0xc]);
                    auVar58[0xd] = -(auVar55[0xd] < auVar106[0xd]);
                    auVar58[0xe] = -(auVar55[0xe] < auVar106[0xe]);
                    auVar58[0xf] = -(auVar55[0xf] < auVar106[0xf]);
                    *(undefined1 (*) [16])((long)*ptr_00 + lVar34) =
                         ~auVar58 & auVar55 | auVar106 & auVar58;
                    auVar16._4_4_ = uVar38;
                    auVar16._0_4_ = uVar38;
                    auVar16._8_4_ = uVar38;
                    auVar16._12_4_ = uVar38;
                    auVar82 = psubsb(auVar82,auVar16);
                    auVar102[0] = -(auVar55[0] < auVar82[0]);
                    auVar102[1] = -(auVar55[1] < auVar82[1]);
                    auVar102[2] = -(auVar55[2] < auVar82[2]);
                    auVar102[3] = -(auVar55[3] < auVar82[3]);
                    auVar102[4] = -(auVar55[4] < auVar82[4]);
                    auVar102[5] = -(auVar55[5] < auVar82[5]);
                    auVar102[6] = -(auVar55[6] < auVar82[6]);
                    auVar102[7] = -(auVar55[7] < auVar82[7]);
                    auVar102[8] = -(auVar55[8] < auVar82[8]);
                    auVar102[9] = -(auVar55[9] < auVar82[9]);
                    auVar102[10] = -(auVar55[10] < auVar82[10]);
                    auVar102[0xb] = -(auVar55[0xb] < auVar82[0xb]);
                    auVar102[0xc] = -(auVar55[0xc] < auVar82[0xc]);
                    auVar102[0xd] = -(auVar55[0xd] < auVar82[0xd]);
                    auVar102[0xe] = -(auVar55[0xe] < auVar82[0xe]);
                    auVar102[0xf] = -(auVar55[0xf] < auVar82[0xf]);
                    auVar82 = ~auVar102 & auVar55 | auVar82 & auVar102;
                    auVar54 = *(undefined1 (*) [16])((long)*ptr + lVar34);
                    lVar34 = lVar34 + 0x10;
                    lVar33 = lVar33 + uVar64 * 4;
                  } while (uVar37 << 4 != lVar34);
                  local_1ac = 0;
                  do {
                    uVar22 = ptr_01[uVar30 + 1] - open;
                    if ((int)uVar22 < -0x7f) {
                      uVar22 = 0xffffff80;
                    }
                    auVar103._0_8_ = auVar82._0_8_ << 8;
                    auVar103._8_8_ = auVar82._8_8_ << 8 | auVar82._0_8_ >> 0x38;
                    auVar82 = auVar103 | ~auVar43 & ZEXT416(uVar22);
                    lVar34 = 0;
                    lVar33 = lVar31;
                    do {
                      auVar106 = *(undefined1 (*) [16])((long)*ptr_02 + lVar34);
                      auVar105[0] = -(auVar82[0] < auVar106[0]);
                      auVar105[1] = -(auVar82[1] < auVar106[1]);
                      auVar105[2] = -(auVar82[2] < auVar106[2]);
                      auVar105[3] = -(auVar82[3] < auVar106[3]);
                      auVar105[4] = -(auVar82[4] < auVar106[4]);
                      auVar105[5] = -(auVar82[5] < auVar106[5]);
                      auVar105[6] = -(auVar82[6] < auVar106[6]);
                      auVar105[7] = -(auVar82[7] < auVar106[7]);
                      auVar105[8] = -(auVar82[8] < auVar106[8]);
                      auVar105[9] = -(auVar82[9] < auVar106[9]);
                      auVar105[10] = -(auVar82[10] < auVar106[10]);
                      auVar105[0xb] = -(auVar82[0xb] < auVar106[0xb]);
                      auVar105[0xc] = -(auVar82[0xc] < auVar106[0xc]);
                      auVar105[0xd] = -(auVar82[0xd] < auVar106[0xd]);
                      auVar105[0xe] = -(auVar82[0xe] < auVar106[0xe]);
                      auVar105[0xf] = -(auVar82[0xf] < auVar106[0xf]);
                      auVar106 = ~auVar105 & auVar82 | auVar106 & auVar105;
                      *(undefined1 (*) [16])((long)*ptr_02 + lVar34) = auVar106;
                      piVar14 = ((ppVar23->field_4).rowcols)->score_row;
                      cVar28 = *(char *)((long)*ptr_02 + lVar34 + 1);
                      cVar35 = *(char *)((long)*ptr_02 + lVar34 + 2);
                      cVar110 = *(char *)((long)*ptr_02 + lVar34 + 3);
                      cVar111 = *(char *)((long)*ptr_02 + lVar34 + 4);
                      cVar1 = *(char *)((long)*ptr_02 + lVar34 + 5);
                      cVar2 = *(char *)((long)*ptr_02 + lVar34 + 6);
                      cVar3 = *(char *)((long)*ptr_02 + lVar34 + 7);
                      cVar4 = *(char *)((long)*ptr_02 + lVar34 + 8);
                      cVar5 = *(char *)((long)*ptr_02 + lVar34 + 9);
                      cVar6 = *(char *)((long)*ptr_02 + lVar34 + 10);
                      cVar7 = *(char *)((long)*ptr_02 + lVar34 + 0xb);
                      cVar8 = *(char *)((long)*ptr_02 + lVar34 + 0xc);
                      cVar9 = *(char *)((long)*ptr_02 + lVar34 + 0xd);
                      cVar10 = *(char *)((long)*ptr_02 + lVar34 + 0xe);
                      cVar11 = *(char *)((long)*ptr_02 + lVar34 + 0xf);
                      *(int *)((long)piVar14 + lVar33) = (int)*(char *)((long)*ptr_02 + lVar34);
                      *(int *)((long)piVar14 + lVar26 * 4 + lVar33) = (int)cVar28;
                      *(int *)((long)piVar14 + lVar26 * 8 + lVar33) = (int)cVar35;
                      *(int *)((long)piVar14 + lVar26 * 0xc + lVar33) = (int)cVar110;
                      *(int *)((long)piVar14 + lVar26 * 0x10 + lVar33) = (int)cVar111;
                      *(int *)((long)piVar14 + lVar26 * 0x14 + lVar33) = (int)cVar1;
                      *(int *)((long)piVar14 + lVar26 * 0x18 + lVar33) = (int)cVar2;
                      *(int *)((long)piVar14 + lVar26 * 0x1c + lVar33) = (int)cVar3;
                      *(int *)((long)piVar14 + lVar26 * 0x20 + lVar33) = (int)cVar4;
                      *(int *)((long)piVar14 + lVar26 * 0x24 + lVar33) = (int)cVar5;
                      *(int *)((long)piVar14 + lVar26 * 0x28 + lVar33) = (int)cVar6;
                      *(int *)((long)piVar14 + lVar26 * 0x2c + lVar33) = (int)cVar7;
                      *(int *)((long)piVar14 + lVar26 * 0x30 + lVar33) = (int)cVar8;
                      *(int *)((long)piVar14 + lVar26 * 0x34 + lVar33) = (int)cVar9;
                      *(int *)((long)piVar14 + lVar26 * 0x38 + lVar33) = (int)cVar10;
                      *(int *)((long)piVar14 + lVar26 * 0x3c + lVar33) = (int)cVar11;
                      auVar59[0] = -(auVar106[0] < auVar57[0]);
                      auVar59[1] = -(auVar106[1] < auVar57[1]);
                      auVar59[2] = -(auVar106[2] < auVar57[2]);
                      auVar59[3] = -(auVar106[3] < auVar57[3]);
                      auVar59[4] = -(auVar106[4] < auVar57[4]);
                      auVar59[5] = -(auVar106[5] < auVar57[5]);
                      auVar59[6] = -(auVar106[6] < auVar57[6]);
                      auVar59[7] = -(auVar106[7] < auVar57[7]);
                      auVar59[8] = -(auVar106[8] < auVar57[8]);
                      auVar59[9] = -(auVar106[9] < auVar57[9]);
                      auVar59[10] = -(auVar106[10] < auVar57[10]);
                      auVar59[0xb] = -(auVar106[0xb] < auVar57[0xb]);
                      auVar59[0xc] = -(auVar106[0xc] < auVar57[0xc]);
                      auVar59[0xd] = -(auVar106[0xd] < auVar57[0xd]);
                      auVar59[0xe] = -(auVar106[0xe] < auVar57[0xe]);
                      auVar59[0xf] = -(auVar106[0xf] < auVar57[0xf]);
                      auVar57 = ~auVar59 & auVar57 | auVar106 & auVar59;
                      auVar74[0] = -(auVar106[0] < auVar73[0]);
                      auVar74[1] = -(auVar106[1] < auVar73[1]);
                      auVar74[2] = -(auVar106[2] < auVar73[2]);
                      auVar74[3] = -(auVar106[3] < auVar73[3]);
                      auVar74[4] = -(auVar106[4] < auVar73[4]);
                      auVar74[5] = -(auVar106[5] < auVar73[5]);
                      auVar74[6] = -(auVar106[6] < auVar73[6]);
                      auVar74[7] = -(auVar106[7] < auVar73[7]);
                      auVar74[8] = -(auVar106[8] < auVar73[8]);
                      auVar74[9] = -(auVar106[9] < auVar73[9]);
                      auVar74[10] = -(auVar106[10] < auVar73[10]);
                      auVar74[0xb] = -(auVar106[0xb] < auVar73[0xb]);
                      auVar74[0xc] = -(auVar106[0xc] < auVar73[0xc]);
                      auVar74[0xd] = -(auVar106[0xd] < auVar73[0xd]);
                      auVar74[0xe] = -(auVar106[0xe] < auVar73[0xe]);
                      auVar74[0xf] = -(auVar106[0xf] < auVar73[0xf]);
                      auVar73 = ~auVar74 & auVar106 | auVar73 & auVar74;
                      auVar106 = psubsb(auVar106,auVar81);
                      auVar17._4_4_ = uVar38;
                      auVar17._0_4_ = uVar38;
                      auVar17._8_4_ = uVar38;
                      auVar17._12_4_ = uVar38;
                      auVar82 = psubsb(auVar82,auVar17);
                      auVar60[0] = -(auVar106[0] < auVar82[0]);
                      auVar60[1] = -(auVar106[1] < auVar82[1]);
                      auVar60[2] = -(auVar106[2] < auVar82[2]);
                      auVar60[3] = -(auVar106[3] < auVar82[3]);
                      auVar60[4] = -(auVar106[4] < auVar82[4]);
                      auVar60[5] = -(auVar106[5] < auVar82[5]);
                      auVar60[6] = -(auVar106[6] < auVar82[6]);
                      auVar60[7] = -(auVar106[7] < auVar82[7]);
                      auVar60[8] = -(auVar106[8] < auVar82[8]);
                      auVar60[9] = -(auVar106[9] < auVar82[9]);
                      auVar60[10] = -(auVar106[10] < auVar82[10]);
                      auVar60[0xb] = -(auVar106[0xb] < auVar82[0xb]);
                      auVar60[0xc] = -(auVar106[0xc] < auVar82[0xc]);
                      auVar60[0xd] = -(auVar106[0xd] < auVar82[0xd]);
                      auVar60[0xe] = -(auVar106[0xe] < auVar82[0xe]);
                      auVar60[0xf] = -(auVar106[0xf] < auVar82[0xf]);
                      if ((((((((((((((((auVar60 >> 7 & (undefined1  [16])0x1) ==
                                        (undefined1  [16])0x0 &&
                                       (auVar60 >> 0xf & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                      (auVar60 >> 0x17 & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0) &&
                                     (auVar60 >> 0x1f & (undefined1  [16])0x1) ==
                                     (undefined1  [16])0x0) &&
                                    (auVar60 >> 0x27 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                                   (auVar60 >> 0x2f & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) &&
                                  (auVar60 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                  ) && (auVar60 >> 0x3f & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                (auVar60 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                               && (auVar60 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               ) && (auVar60 >> 0x57 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                             (auVar60 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar60 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar60 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar60 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          -1 < auVar60[0xf]) goto LAB_005c6e25;
                      lVar34 = lVar34 + 0x10;
                      lVar33 = lVar33 + uVar64 * 4;
                    } while (uVar37 << 4 != lVar34);
                    local_1ac = local_1ac + 1;
                  } while (local_1ac != 0x10);
LAB_005c6e25:
                  uVar30 = uVar30 + 1;
                  lVar31 = lVar31 + 4;
                  palVar24 = ptr_02;
                  if (uVar30 == uVar64) {
                    uVar64 = ptr_02[(ulong)uVar20 % uVar37][1];
                    if (iVar21 < 0xf) {
                      iVar27 = 0;
                      uVar37 = ptr_02[(ulong)uVar20 % uVar37][0];
                      do {
                        uVar64 = uVar64 << 8 | uVar37 >> 0x38;
                        iVar27 = iVar27 + 1;
                        uVar37 = uVar37 << 8;
                      } while (iVar27 < 0xf - iVar21);
                    }
                    cVar28 = auVar41[0];
                    auVar109[0] = -(auVar57[0] < cVar28);
                    cVar35 = auVar41[1];
                    auVar109[1] = -(auVar57[1] < cVar35);
                    cVar110 = auVar41[2];
                    auVar109[2] = -(auVar57[2] < cVar110);
                    cVar111 = auVar41[3];
                    auVar109[3] = -(auVar57[3] < cVar111);
                    auVar109[4] = -(auVar57[4] < cVar28);
                    auVar109[5] = -(auVar57[5] < cVar35);
                    auVar109[6] = -(auVar57[6] < cVar110);
                    auVar109[7] = -(auVar57[7] < cVar111);
                    auVar109[8] = -(auVar57[8] < cVar28);
                    auVar109[9] = -(auVar57[9] < cVar35);
                    auVar109[10] = -(auVar57[10] < cVar110);
                    auVar109[0xb] = -(auVar57[0xb] < cVar111);
                    auVar109[0xc] = -(auVar57[0xc] < cVar28);
                    auVar109[0xd] = -(auVar57[0xd] < cVar35);
                    auVar109[0xe] = -(auVar57[0xe] < cVar110);
                    auVar109[0xf] = -(auVar57[0xf] < cVar111);
                    cVar28 = auVar42[0];
                    auVar75[0] = -(cVar28 < auVar73[0]);
                    cVar35 = auVar42[1];
                    auVar75[1] = -(cVar35 < auVar73[1]);
                    cVar110 = auVar42[2];
                    auVar75[2] = -(cVar110 < auVar73[2]);
                    cVar111 = auVar42[3];
                    auVar75[3] = -(cVar111 < auVar73[3]);
                    auVar75[4] = -(cVar28 < auVar73[4]);
                    auVar75[5] = -(cVar35 < auVar73[5]);
                    auVar75[6] = -(cVar110 < auVar73[6]);
                    auVar75[7] = -(cVar111 < auVar73[7]);
                    auVar75[8] = -(cVar28 < auVar73[8]);
                    auVar75[9] = -(cVar35 < auVar73[9]);
                    auVar75[10] = -(cVar110 < auVar73[10]);
                    auVar75[0xb] = -(cVar111 < auVar73[0xb]);
                    auVar75[0xc] = -(cVar28 < auVar73[0xc]);
                    auVar75[0xd] = -(cVar35 < auVar73[0xd]);
                    auVar75[0xe] = -(cVar110 < auVar73[0xe]);
                    auVar75[0xf] = -(cVar111 < auVar73[0xf]);
                    auVar75 = auVar75 | auVar109;
                    if ((((((((((((((((auVar75 >> 7 & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0 &&
                                     (auVar75 >> 0xf & (undefined1  [16])0x1) ==
                                     (undefined1  [16])0x0) &&
                                    (auVar75 >> 0x17 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                                   (auVar75 >> 0x1f & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) &&
                                  (auVar75 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                  ) && (auVar75 >> 0x2f & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                (auVar75 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                               && (auVar75 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               ) && (auVar75 >> 0x47 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                             (auVar75 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar75 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar75 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar75 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar75 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar75 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        -1 < auVar75[0xf]) {
                      cVar28 = (char)(uVar64 >> 0x38);
                    }
                    else {
                      *(byte *)&ppVar23->flag = (byte)ppVar23->flag | 0x40;
                      cVar28 = '\0';
                      iVar25 = 0;
                      uVar20 = 0;
                    }
                    ppVar23->score = (int)cVar28;
                    ppVar23->end_query = uVar20;
                    ppVar23->end_ref = iVar25;
                    parasail_free(ptr_01);
                    parasail_free(ptr_00);
                    parasail_free(ptr);
                    parasail_free(ptr_02);
                    return ppVar23;
                  }
                } while( true );
              }
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvE = NULL;
    int8_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int8_t NEG_LIMIT = 0;
    int8_t POS_LIMIT = 0;
    int8_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile8.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 16; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile = (__m128i*)profile->profile8.score;
    vGapO = _mm_set1_epi8(open);
    vGapE = _mm_set1_epi8(gap);
    NEG_LIMIT = (-open < matrix->min ? INT8_MIN + open : INT8_MIN - matrix->min) + 1;
    POS_LIMIT = INT8_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi8(NEG_LIMIT);
    vPosLimit = _mm_set1_epi8(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_8 | PARASAIL_FLAG_LANES_16;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m128i(16, segLen);
    pvHLoad  = parasail_memalign___m128i(16, segLen);
    pvE      = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int8_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!boundary) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_8_t h;
            __m128i_8_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT8_MIN ? INT8_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT8_MIN ? INT8_MIN : tmp;
            }
            _mm_store_si128(&pvHStore[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT8_MIN ? INT8_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        /* Initialize F value to -inf.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        __m128i vF = vNegLimit;

        /* load final segment of pvHStore and shift left by 2 bytes */
        __m128i vH = _mm_slli_si128(pvHStore[segLen - 1], 1);

        /* Correct part of the vProfile */
        const __m128i* vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        __m128i* pv = pvHLoad;
        pvHLoad = pvHStore;
        pvHStore = pv;

        /* insert upper boundary condition */
        vH = _mm_insert_epi8_rpl(vH, boundary[j], 0);

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm_adds_epi8(vH, _mm_load_si128(vP + i));
            vE = _mm_load_si128(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm_max_epi8_rpl(vH, vE);
            vH = _mm_max_epi8_rpl(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);
            vSaturationCheckMax = _mm_max_epi8_rpl(vSaturationCheckMax, vH);
            vSaturationCheckMin = _mm_min_epi8_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm_min_epi8_rpl(vSaturationCheckMin, vE);
            vSaturationCheckMin = _mm_min_epi8_rpl(vSaturationCheckMin, vF);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif

            /* Update vE value. */
            vH = _mm_subs_epi8(vH, vGapO);
            vE = _mm_subs_epi8(vE, vGapE);
            vE = _mm_max_epi8_rpl(vE, vH);
            _mm_store_si128(pvE + i, vE);

            /* Update vF value. */
            vF = _mm_subs_epi8(vF, vGapE);
            vF = _mm_max_epi8_rpl(vF, vH);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            int64_t tmp = boundary[j+1]-open;
            int8_t tmp2 = tmp < INT8_MIN ? INT8_MIN : tmp;
            vF = _mm_slli_si128(vF, 1);
            vF = _mm_insert_epi8_rpl(vF, tmp2, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi8_rpl(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                vSaturationCheckMin = _mm_min_epi8_rpl(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm_max_epi8_rpl(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vH = _mm_subs_epi8(vH, vGapO);
                vF = _mm_subs_epi8(vF, vGapE);
                if (! _mm_movemask_epi8(_mm_cmpgt_epi8(vF, vH))) goto end;
                /*vF = _mm_max_epi8_rpl(vF, vH);*/
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 1);
            }
            result->rowcols->score_row[j] = (int8_t) _mm_extract_epi8_rpl (vH, 15);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m128i vH = _mm_load_si128(pvHStore + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128 (vH, 1);
        }
        score = (int8_t) _mm_extract_epi8_rpl (vH, 15);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi8(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi8(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(boundary);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}